

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::BasicReporter::streamVariableLengthText(BasicReporter *this,string *prefix,string *text)

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  string trimmed;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  lVar1 = std::__cxx11::string::find_first_not_of((char *)text,0x1531c6,0);
  std::__cxx11::string::find_last_not_of((char *)text,0x1531c6,0xffffffffffffffff);
  if (lVar1 == -1) {
    local_48 = local_38;
    local_40 = 0;
    local_38[0] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)text);
  }
  lVar1 = std::__cxx11::string::find_first_of((char *)&local_48,0x153177,0);
  poVar2 = (this->m_config).m_stream;
  if (lVar1 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[",1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_48,local_40);
    lVar1 = 1;
    pcVar3 = "]";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n[",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"] >>>>>>>>>>>>>>>>>>>>>>>>>>>>>>>\n",0x22);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_48,local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n[end of ",9);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    lVar1 = 0x1b;
    pcVar3 = "] <<<<<<<<<<<<<<<<<<<<<<<<\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,lVar1);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

void streamVariableLengthText( const std::string& prefix, const std::string& text ) {
            std::string trimmed = trim( text );
            if( trimmed.find_first_of( "\r\n" ) == std::string::npos ) {
                m_config.stream() << "[" << prefix << ": " << trimmed << "]";
            }
            else {
                m_config.stream() << "\n[" << prefix << "] >>>>>>>>>>>>>>>>>>>>>>>>>>>>>>>\n" << trimmed
                << "\n[end of " << prefix << "] <<<<<<<<<<<<<<<<<<<<<<<<\n";
            }
        }